

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

int uws_client_set_request_header(UWS_CLIENT_HANDLE uws_client,char *name,char *value)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  char *value_local;
  char *name_local;
  UWS_CLIENT_HANDLE uws_client_local;
  
  if (((uws_client == (UWS_CLIENT_HANDLE)0x0) || (name == (char *)0x0)) || (value == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_set_request_header",0x8df,1,
                "invalid parameter (uws_client=%p, name=%p, value=%p)",uws_client,name,value);
    }
    l._4_4_ = 0x8e0;
  }
  else {
    MVar1 = Map_AddOrUpdate(uws_client->request_headers,name,value);
    if (MVar1 == MAP_OK) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                  ,"uws_client_set_request_header",0x8e6,1,"Failed adding request header %s",name);
      }
      l._4_4_ = 0x8e7;
    }
  }
  return l._4_4_;
}

Assistant:

int uws_client_set_request_header(UWS_CLIENT_HANDLE uws_client, const char* name, const char* value)
{
    int result;

    if (uws_client == NULL || name == NULL || value == NULL)
    {
        // Codes_SRS_UWS_CLIENT_09_002: [ If any of the arguments uws_client or name or value is NULL uws_client_set_request_header shall fail and return a non-zero value. ]
        LogError("invalid parameter (uws_client=%p, name=%p, value=%p)", uws_client, name, value);
        result = MU_FAILURE;
    }
    // Codes_SRS_UWS_CLIENT_09_003: [ A copy of name and value shall be stored for later sending in the request message. ]
    else if (Map_AddOrUpdate(uws_client->request_headers, name, value) != MAP_OK)
    {
        // Codes_SRS_UWS_CLIENT_09_004: [ If name or value fail to be stored the function shall fail and return a non-zero value. ]
        LogError("Failed adding request header %s", name);
        result = MU_FAILURE;
    }
    else
    {
        // Codes_SRS_UWS_CLIENT_09_005: [ If no failures occur the function shall return zero. ]
        result = 0;
    }

    return result;
}